

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SingleCharFinder.hpp
# Opt level: O3

void __thiscall
peach::fsm::SingleCharFinder::SingleCharFinder
          (SingleCharFinder *this,
          vector<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
          *chars)

{
  pointer ppVar1;
  element_type *category;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppVar2;
  shared_ptr<peach::fsm::Node> charNode;
  Node local_50;
  
  FiniteStateMachine::FiniteStateMachine(&this->super_FiniteStateMachine);
  ppVar2 = (chars->
           super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (chars->
           super__Vector_base<std::pair<char,_unsigned_long>,_std::allocator<std::pair<char,_unsigned_long>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar2 != ppVar1) {
    do {
      category = (this->super_FiniteStateMachine).root_.
                 super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_00 = (this->super_FiniteStateMachine).root_.
                super___shared_ptr<peach::fsm::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      Node::addTransitionToNewNode<peach::transition::SingleCharTransition,char_const&>
                (&local_50,(tokenCategory_t)category,(char *)0x0);
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      Node::addTransitionToNewNode<peach::transition::TrueTransition>
                ((Node *)&local_50.transitions_.
                          super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (tokenCategory_t)
                 local_50.transitions_.
                 super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.category_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.category_);
      }
      if (local_50.transitions_.
          super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_50.transitions_.
                   super__Vector_base<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>,_std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,_std::default_delete<peach::transition::CharTransition>_>,_std::shared_ptr<peach::fsm::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      }
      ppVar2 = ppVar2 + 1;
    } while (ppVar2 != ppVar1);
  }
  return;
}

Assistant:

SingleCharFinder(const std::vector<std::pair<char, token::tokenCategory_t>> &chars)
    {
        for (const auto &[ch, category] : chars)
        {
            auto charNode = getRoot()->addTransitionToNewNode<transition::SingleCharTransition>(token::tokenCategory::UNDEFINED, ch);
            charNode->addTransitionToNewNode<transition::TrueTransition>(category);
        }
    }